

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

void acutest_run_(acutest_test_ *test,int index,int master_index)

{
  acutest_state_ exit_code_00;
  int *piVar1;
  char *pcVar2;
  uint *puVar3;
  double dVar4;
  char **local_70;
  char *signame;
  char tmp [32];
  int exit_code;
  pid_t pid;
  acutest_timer_type_ end;
  acutest_timer_type_ start;
  acutest_state_ state;
  int master_index_local;
  int index_local;
  acutest_test_ *test_local;
  
  start.tv_nsec._4_4_ = ACUTEST_STATE_FAILED;
  acutest_test_already_logged_ = 0;
  acutest_current_test_ = test;
  acutest_timer_get_time_((timespec *)&end.tv_nsec);
  if (acutest_no_exec_ == 0) {
    fflush(_stdout);
    fflush(_stderr);
    tmp._28_4_ = fork();
    if (tmp._28_4_ == -1) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      puVar3 = (uint *)__errno_location();
      acutest_error_("Cannot fork. %s [%d]",pcVar2,(ulong)*puVar3);
    }
    else {
      if (tmp._28_4_ == 0) {
        acutest_worker_ = 1;
        exit_code_00 = acutest_do_run_(test,index);
        acutest_exit_(exit_code_00);
      }
      waitpid(tmp._28_4_,(int *)(tmp + 0x18),0);
      if ((tmp._24_4_ & 0x7f) == 0) {
        start.tv_nsec._4_4_ = (int)(tmp._24_4_ & 0xff00) >> 8;
      }
      else if ((char)(((byte)tmp._24_4_ & 0x7f) + 1) >> 1 < '\x01') {
        acutest_error_("Test ended in an unexpected way [%d].",(ulong)(uint)tmp._24_4_);
      }
      else {
        switch(tmp._24_4_ & 0x7f) {
        case 1:
          local_70 = (char **)0x152eb2;
          break;
        case 2:
          local_70 = (char **)0x152eab;
          break;
        case 3:
          local_70 = (char **)0x152eb9;
          break;
        case 4:
          local_70 = (char **)0x152ed9;
          break;
        default:
          snprintf((char *)&signame,0x20,"signal %d",(ulong)(tmp._24_4_ & 0x7f));
          local_70 = &signame;
          break;
        case 6:
          local_70 = (char **)0x152ec1;
          break;
        case 9:
          local_70 = (char **)0x152ec9;
          break;
        case 0xb:
          local_70 = (char **)0x152ed1;
          break;
        case 0xf:
          local_70 = (char **)0x152ee0;
        }
        acutest_error_("Test interrupted by %s.",local_70);
      }
    }
  }
  else {
    start.tv_nsec._4_4_ = acutest_do_run_(test,index);
  }
  acutest_timer_get_time_((timespec *)&exit_code);
  acutest_current_test_ = (acutest_test_ *)0x0;
  acutest_test_data_[master_index].state = start.tv_nsec._4_4_;
  dVar4 = acutest_timer_diff_(stack0xffffffffffffffd0,_exit_code);
  acutest_test_data_[master_index].duration = dVar4;
  return;
}

Assistant:

static void
acutest_run_(const struct acutest_test_* test, int index, int master_index)
{
    enum acutest_state_ state = ACUTEST_STATE_FAILED;
    acutest_timer_type_ start, end;

    acutest_current_test_ = test;
    acutest_test_already_logged_ = 0;
    acutest_timer_get_time_(&start);

    if(!acutest_no_exec_) {

#if defined(ACUTEST_UNIX_)

        pid_t pid;
        int exit_code;

        /* Make sure the child starts with empty I/O buffers. */
        fflush(stdout);
        fflush(stderr);

        pid = fork();
        if(pid == (pid_t)-1) {
            acutest_error_("Cannot fork. %s [%d]", strerror(errno), errno);
        } else if(pid == 0) {
            /* Child: Do the test. */
            acutest_worker_ = 1;
            state = acutest_do_run_(test, index);
            acutest_exit_((int) state);
        } else {
            /* Parent: Wait until child terminates and analyze its exit code. */
            waitpid(pid, &exit_code, 0);
            if(WIFEXITED(exit_code)) {
                state = (enum acutest_state_) WEXITSTATUS(exit_code);
            } else if(WIFSIGNALED(exit_code)) {
                char tmp[32];
                const char* signame;
                switch(WTERMSIG(exit_code)) {
                    case SIGINT:  signame = "SIGINT"; break;
                    case SIGHUP:  signame = "SIGHUP"; break;
                    case SIGQUIT: signame = "SIGQUIT"; break;
                    case SIGABRT: signame = "SIGABRT"; break;
                    case SIGKILL: signame = "SIGKILL"; break;
                    case SIGSEGV: signame = "SIGSEGV"; break;
                    case SIGILL:  signame = "SIGILL"; break;
                    case SIGTERM: signame = "SIGTERM"; break;
                    default:      snprintf(tmp, sizeof(tmp), "signal %d", WTERMSIG(exit_code)); signame = tmp; break;
                }
                acutest_error_("Test interrupted by %s.", signame);
            } else {
                acutest_error_("Test ended in an unexpected way [%d].", exit_code);
            }
        }

#elif defined(ACUTEST_WIN_)

        char buffer[512] = {0};
        STARTUPINFOA startupInfo;
        PROCESS_INFORMATION processInfo;
        DWORD exitCode;

        /* Windows has no fork(). So we propagate all info into the child
         * through a command line arguments. */
        snprintf(buffer, sizeof(buffer),
                 "%s --worker=%d %s --no-exec --no-summary %s --verbose=%d --color=%s -- \"%s\"",
                 acutest_argv0_, index, acutest_timer_ ? "--time" : "",
                 acutest_tap_ ? "--tap" : "", acutest_verbose_level_,
                 acutest_colorize_ ? "always" : "never",
                 test->name);
        memset(&startupInfo, 0, sizeof(startupInfo));
        startupInfo.cb = sizeof(STARTUPINFO);
        if(CreateProcessA(NULL, buffer, NULL, NULL, FALSE, 0, NULL, NULL, &startupInfo, &processInfo)) {
            WaitForSingleObject(processInfo.hProcess, INFINITE);
            GetExitCodeProcess(processInfo.hProcess, &exitCode);
            CloseHandle(processInfo.hThread);
            CloseHandle(processInfo.hProcess);
            switch(exitCode) {
                case 0:             state = ACUTEST_STATE_SUCCESS; break;
                case 1:             state = ACUTEST_STATE_FAILED; break;
                case 2:             state = ACUTEST_STATE_SKIPPED; break;
                case 3:             acutest_error_("Aborted."); break;
                case 0xC0000005:    acutest_error_("Access violation."); break;
                default:            acutest_error_("Test ended in an unexpected way [%lu].", exitCode); break;
            }
        } else {
            acutest_error_("Cannot create unit test subprocess [%ld].", GetLastError());
        }

#else

        /* A platform where we don't know how to run child process. */
        state = acutest_do_run_(test, index);

#endif

    } else {
        /* Child processes suppressed through --no-exec. */
        state = acutest_do_run_(test, index);
    }
    acutest_timer_get_time_(&end);

    acutest_current_test_ = NULL;

    acutest_test_data_[master_index].state = state;
    acutest_test_data_[master_index].duration = acutest_timer_diff_(start, end);
}